

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrCompositionLayerDepthInfoKHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  invalid_argument *piVar4;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  string type_prefix;
  string farz_prefix;
  string nearz_prefix;
  string maxdepth_prefix;
  string mindepth_prefix;
  string subimage_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  undefined1 local_678 [32];
  string local_658;
  string local_638;
  ostringstream oss_minDepth;
  PFN_xrDestroySession p_Stack_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  PFN_xrGetReferenceSpaceBoundsRect local_5f8;
  PFN_xrCreateActionSpace p_Stack_5f0;
  PFN_xrLocateSpace local_5e8;
  PFN_xrDestroySpace p_Stack_5e0;
  ostringstream oss_farZ;
  undefined8 local_490 [46];
  ostringstream oss_nearZ;
  undefined8 local_318 [46];
  ostringstream oss_maxDepth;
  undefined8 local_1a0 [46];
  
  PointerToHexString<XrCompositionLayerDepthInfoKHR>
            ((XrCompositionLayerDepthInfoKHR *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_minDepth);
  std::__cxx11::string::~string((string *)&oss_minDepth);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_minDepth,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_minDepth);
    std::__cxx11::string::~string((string *)&oss_minDepth);
  }
  else {
    local_5e8 = (PFN_xrLocateSpace)0x0;
    p_Stack_5e0 = (PFN_xrDestroySpace)0x0;
    local_5f8 = (PFN_xrGetReferenceSpaceBoundsRect)0x0;
    p_Stack_5f0 = (PFN_xrCreateActionSpace)0x0;
    local_608._M_allocated_capacity = 0;
    local_608._8_8_ = 0;
    _oss_minDepth = (pointer)0x0;
    p_Stack_610 = (PFN_xrDestroySession)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_minDepth);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_minDepth);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_638,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_638,contents);
  std::__cxx11::string::~string((string *)&local_638);
  if (bVar2) {
    std::__cxx11::string::string((string *)&subimage_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&subimage_prefix);
    std::__cxx11::string::string((string *)(local_678 + 0x20),(string *)&subimage_prefix);
    gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_678;
    std::__cxx11::string::string
              ((string *)gen_dispatch_table_00,"XrSwapchainSubImage",(allocator *)&oss_minDepth);
    bVar2 = ApiDumpOutputXrStruct
                      (gen_dispatch_table_00,&value->subImage,(string *)(local_678 + 0x20),
                       (string *)local_678,false,contents);
    std::__cxx11::string::~string((string *)local_678);
    std::__cxx11::string::~string((string *)(local_678 + 0x20));
    if (bVar2) {
      std::__cxx11::string::string((string *)&mindepth_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&mindepth_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_minDepth);
      *(undefined8 *)((long)&p_Stack_610 + *(long *)(_oss_minDepth + -0x18)) = 0x20;
      std::ostream::operator<<((ostream *)&oss_minDepth,value->minDepth);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [6])"float",&mindepth_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_maxDepth)
      ;
      std::__cxx11::string::~string((string *)&oss_maxDepth);
      std::__cxx11::string::string((string *)&maxdepth_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&maxdepth_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_maxDepth);
      *(undefined8 *)((long)local_1a0 + *(long *)(_oss_maxDepth + -0x18)) = 0x20;
      std::ostream::operator<<((ostream *)&oss_maxDepth,value->maxDepth);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [6])"float",&maxdepth_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_nearZ);
      std::__cxx11::string::~string((string *)&oss_nearZ);
      std::__cxx11::string::string((string *)&nearz_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&nearz_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_nearZ);
      *(undefined8 *)((long)local_318 + *(long *)(_oss_nearZ + -0x18)) = 0x20;
      std::ostream::operator<<((ostream *)&oss_nearZ,value->nearZ);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [6])"float",&nearz_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_farZ);
      std::__cxx11::string::~string((string *)&oss_farZ);
      std::__cxx11::string::string((string *)&farz_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&farz_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_farZ);
      *(undefined8 *)((long)local_490 + *(long *)(_oss_farZ + -0x18)) = 0x20;
      std::ostream::operator<<((ostream *)&oss_farZ,value->farZ);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [6])"float",&farz_prefix,&local_698);
      std::__cxx11::string::~string((string *)&local_698);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_farZ);
      std::__cxx11::string::~string((string *)&farz_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_nearZ);
      std::__cxx11::string::~string((string *)&nearz_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_maxDepth);
      std::__cxx11::string::~string((string *)&maxdepth_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_minDepth);
      std::__cxx11::string::~string((string *)&mindepth_prefix);
      std::__cxx11::string::~string((string *)&subimage_prefix);
      std::__cxx11::string::~string((string *)&next_prefix);
      std::__cxx11::string::~string((string *)&type_prefix);
      return true;
    }
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrCompositionLayerDepthInfoKHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string subimage_prefix = prefix;
        subimage_prefix += "subImage";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->subImage, subimage_prefix, "XrSwapchainSubImage", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string mindepth_prefix = prefix;
        mindepth_prefix += "minDepth";
        std::ostringstream oss_minDepth;
        oss_minDepth << std::setprecision(32) << (value->minDepth);
        contents.emplace_back("float", mindepth_prefix, oss_minDepth.str());
        std::string maxdepth_prefix = prefix;
        maxdepth_prefix += "maxDepth";
        std::ostringstream oss_maxDepth;
        oss_maxDepth << std::setprecision(32) << (value->maxDepth);
        contents.emplace_back("float", maxdepth_prefix, oss_maxDepth.str());
        std::string nearz_prefix = prefix;
        nearz_prefix += "nearZ";
        std::ostringstream oss_nearZ;
        oss_nearZ << std::setprecision(32) << (value->nearZ);
        contents.emplace_back("float", nearz_prefix, oss_nearZ.str());
        std::string farz_prefix = prefix;
        farz_prefix += "farZ";
        std::ostringstream oss_farZ;
        oss_farZ << std::setprecision(32) << (value->farZ);
        contents.emplace_back("float", farz_prefix, oss_farZ.str());
        return true;
    } catch(...) {
    }
    return false;
}